

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  char local_45;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    uVar3 = 1;
  }
  else {
    bVar1 = true;
    local_34 = 0;
    local_3c = 0;
    local_44 = 0;
    local_40 = 0;
    local_38 = 0;
    uVar9 = 2;
    do {
      pcVar6 = argv[uVar9 - 1];
      iVar2 = strcmp(pcVar6,"-h");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar6,"--help"), iVar2 == 0)) {
        usageMessage((ostream *)&std::cout,"exrcheck",true);
        break;
      }
      iVar2 = strcmp(pcVar6,"-m");
      if (iVar2 == 0) {
        local_34 = 1;
      }
      else {
        iVar2 = strcmp(pcVar6,"-t");
        if (iVar2 == 0) {
          local_38 = 1;
        }
        else {
          iVar2 = strcmp(pcVar6,"-s");
          if (iVar2 == 0) {
            local_3c = 1;
          }
          else {
            iVar2 = strcmp(pcVar6,"-c");
            if (iVar2 == 0) {
              local_40 = 1;
            }
            else {
              iVar2 = strcmp(pcVar6,"--version");
              if (iVar2 == 0) {
                pcVar6 = (char *)Imf_3_2::getLibraryVersion();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"exrcheck (OpenEXR) ",0x13);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.2.0",5);
                iVar2 = strcmp(pcVar6,"3.2.0");
                if (iVar2 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"(OpenEXR version ",0x11);
                  poVar5 = std::operator<<((ostream *)&std::cout,pcVar6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout," https://openexr.com",0x14);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                std::ostream::put(-0x78);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project"
                           ,0x31);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                std::ostream::put(-0x78);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                std::ostream::put(-0x78);
                std::ostream::flush();
                break;
              }
              iVar2 = access(pcVar6,4);
              if (iVar2 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"No such file: ",0xe);
                pcVar6 = argv[uVar9 - 1];
                if (pcVar6 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106100);
                }
                else {
                  sVar4 = strlen(pcVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar6,sVar4);
                }
                bVar8 = (byte)local_44;
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
                std::ostream::put('\0');
                std::ostream::flush();
                uVar7 = 0xffffffff;
                goto LAB_001028d1;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," file ",6);
              pcVar6 = argv[uVar9 - 1];
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106088);
              }
              else {
                sVar4 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar4);
              }
              local_45 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_45,1);
              std::ostream::flush();
              bVar1 = exrCheck(argv[uVar9 - 1],(bool)((byte)local_34 & 1),(bool)((byte)local_38 & 1)
                               ,(bool)((byte)local_3c & 1),(bool)((byte)local_40 & 1));
              if (bVar1) {
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,"bad\n",4);
                local_44 = (undefined4)CONCAT71((int7)((ulong)poVar5 >> 8),1);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK\n",3);
              }
            }
          }
        }
      }
      bVar1 = uVar9 < (uint)argc;
      bVar10 = uVar9 != (uint)argc;
      uVar9 = uVar9 + 1;
    } while (bVar10);
    uVar7 = 0;
    bVar8 = (byte)local_44;
LAB_001028d1:
    uVar3 = (uint)(bVar8 & 1);
    if (bVar1) {
      uVar3 = uVar7;
    }
  }
  return uVar3;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    bool reduceMemory    = false;
    bool reduceTime      = false;
    bool enableCoreCheck = false;
    bool badFileFound    = false;
    bool useStream       = false;
    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrcheck", true);
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            //
            // note for further memory reduction, calls to the following could be added here
            // CompositeDeepScanLine::setMaximumSampleCount();
            // Header::setMaxImageSize();
            // Header::setMaxTileSize();

            reduceMemory = true;

        }
        else if (!strcmp (argv[i], "-t"))
        {
            reduceTime = true;
        }
        else if (!strcmp (argv[i], "-s"))
        {
            useStream = true;
        }
        else if (!strcmp (argv[i], "-c"))
        {
            enableCoreCheck = true;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion();
            
            cout << "exrcheck (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {

#if defined _WIN32 || defined _WIN64
            if (_access (argv[i], 4) != 0)
#else
            if (access (argv[i], R_OK) != 0)
#endif
            {
                cerr << "No such file: " << argv[i] << endl;
                return -1;
            }

            cout << " file " << argv[i] << ' ';
            cout.flush ();

            bool hasError = exrCheck (
                argv[i], reduceMemory, reduceTime, useStream, enableCoreCheck);
            if (hasError)
            {
                cout << "bad\n";
                badFileFound = true;
            }
            else
            {
                cout << "OK\n";
            }
        }
    }

    return badFileFound;
}